

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCaseBinaryInt::test
          (ShaderBitfieldOperationCaseBinaryInt *this,Data *data)

{
  int iVar1;
  GLint GVar2;
  int i;
  long lVar3;
  GLint expected2;
  GLint local_2c;
  
  for (lVar3 = 0; iVar1 = this->m_components, lVar3 < iVar1; lVar3 = lVar3 + 1) {
    local_2c = 0;
    GVar2 = (*this->m_func)(data->inIvec4[lVar3],data->in2Ivec4[lVar3],&local_2c);
    if ((data->outIvec4[lVar3] != GVar2) || (data->out2Ivec4[lVar3] != local_2c)) break;
  }
  return iVar1 <= lVar3;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected2 = 0;
			GLint expected  = m_func(data->inIvec4[i], data->in2Ivec4[i], expected2);
			if (data->outIvec4[i] != expected || data->out2Ivec4[i] != expected2)
			{
				return false;
			}
		}
		return true;
	}